

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O2

void skiwi::compile_is_symbol(asmcode *code,compiler_options *param_2)

{
  skiwi *this;
  uint64_t in_RDX;
  operand local_44;
  operation local_40 [2];
  operand local_38 [2];
  string lab_false;
  
  this = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&lab_false,this,in_RDX);
  jump_short_if_arg_is_not_block(code,RCX,RAX,&lab_false);
  local_44 = AH;
  local_38[1] = 0xb;
  local_38[0] = NUMBER;
  local_40[0] = ~CMPLTPD;
  local_40[1] = ~ADD;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,&local_44,local_38 + 1,local_38,(unsigned_long *)local_40);
  jump_short_if_arg_does_not_point_to_symbol(code,RCX,RCX,&lab_false);
  local_40[0] = MOV;
  local_44 = RAX;
  local_38[1] = 0x39;
  local_38[0] = RSP;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,local_38 + 1,(int *)local_38);
  local_40[0] = JMP;
  local_44 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  local_40[0] = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_40,&lab_false);
  local_40[0] = MOV;
  local_44 = RAX;
  local_38[1] = 0x39;
  local_38[0] = DL;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_40,&local_44,local_38 + 1,(int *)local_38);
  local_40[0] = 0x2c;
  local_44 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_40,&local_44);
  std::__cxx11::string::~string((string *)&lab_false);
  return;
}

Assistant:

void compile_is_symbol(asmcode& code, const compiler_options&)
  {
  auto lab_false = label_to_string(label++);
  jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::RAX, lab_false);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  jump_short_if_arg_does_not_point_to_symbol(code, asmcode::RCX, asmcode::RCX, lab_false);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_t);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, lab_false);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, bool_f);
  code.add(asmcode::JMP, CONTINUE);
  }